

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_hash_set.c
# Opt level: O0

void ** TIFFHashSetFindPtr(TIFFHashSet *set,void *elt)

{
  _Bool _Var1;
  unsigned_long uVar2;
  TIFFList *local_30;
  TIFFList *cur;
  unsigned_long nHashVal;
  void *elt_local;
  TIFFHashSet *set_local;
  
  uVar2 = (*set->fnHashFunc)(elt);
  local_30 = set->tabList[uVar2 % (ulong)(long)set->nAllocatedSize];
  while( true ) {
    if (local_30 == (TIFFList *)0x0) {
      return (void **)0x0;
    }
    _Var1 = (*set->fnEqualFunc)(local_30->pData,elt);
    if (_Var1) break;
    local_30 = local_30->psNext;
  }
  return &local_30->pData;
}

Assistant:

static void **TIFFHashSetFindPtr(TIFFHashSet *set, const void *elt)
{
    const unsigned long nHashVal = set->fnHashFunc(elt) % set->nAllocatedSize;
    TIFFList *cur = set->tabList[nHashVal];
    while (cur)
    {
        if (set->fnEqualFunc(cur->pData, elt))
            return &cur->pData;
        cur = cur->psNext;
    }
    return NULL;
}